

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferErrors.cpp
# Opt level: O0

void __thiscall glcts::TextureBufferErrors::deinit(TextureBufferErrors *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureBufferErrors *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  (**(code **)(lVar3 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  if (this->m_tex_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_tex_id);
    this->m_tex_id = 0;
  }
  if (this->m_bo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBufferErrors::deinit(void)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, 0);
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);

	/* Delete GLES objects */
	if (m_tex_id != 0)
	{
		gl.deleteTextures(1, &m_tex_id);
		m_tex_id = 0;
	}

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);
		m_bo_id = 0;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}